

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O0

void print_string(LispPTR x)

{
  undefined8 uVar1;
  LispPTR *pLVar2;
  int local_2c;
  DLword *pDStack_28;
  int i;
  DLbyte *string_base;
  DLword st_length;
  stringp *string_point;
  LispPTR x_local;
  
  pLVar2 = NativeAligned4FromLAddr(x);
  uVar1 = *(undefined8 *)pLVar2;
  pDStack_28 = NativeAligned2FromLAddr((uint)*(undefined8 *)pLVar2 & 0xfffffff);
  printf("%c",0x22);
  for (local_2c = 1; local_2c <= (int)(uint)(ushort)((ulong)uVar1 >> 0x20); local_2c = local_2c + 1)
  {
    printf("%c",(ulong)*(byte *)((ulong)pDStack_28 ^ 3));
    pDStack_28 = (DLword *)((long)pDStack_28 + 1);
  }
  printf("%c",0x22);
  return;
}

Assistant:

void print_string(LispPTR x) {
  struct stringp *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (struct stringp *)NativeAligned4FromLAddr(x);
  st_length = string_point->length;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 1; i <= st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}